

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.h
# Opt level: O2

void __thiscall Shader::checkCompileErrors(Shader *this,GLuint shader,string *type)

{
  bool bVar1;
  PFNGLGETSHADERINFOLOGPROC *pp_Var2;
  ostream *poVar3;
  char *pcVar4;
  GLint success;
  GLchar infoLog [1024];
  int local_42c;
  char local_428 [1032];
  
  bVar1 = std::operator!=(type,"PROGRAM");
  if (bVar1) {
    (*glad_glGetShaderiv)(shader,0x8b81,&local_42c);
    if (local_42c != 0) {
      return;
    }
    pcVar4 = "ERROR::SHADER_COMPILATION_ERROR of type: ";
    pp_Var2 = &glad_glGetShaderInfoLog;
  }
  else {
    (*glad_glGetProgramiv)(shader,0x8b82,&local_42c);
    if (local_42c != 0) {
      return;
    }
    pcVar4 = "ERROR::PROGRAM_LINKING_ERROR of type: ";
    pp_Var2 = &glad_glGetProgramInfoLog;
  }
  (**pp_Var2)(shader,0x400,(GLsizei *)0x0,local_428);
  poVar3 = std::operator<<((ostream *)&std::cout,pcVar4);
  poVar3 = std::operator<<(poVar3,(string *)type);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,local_428);
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void checkCompileErrors(GLuint shader,string type)
    {
        GLint success;
        GLchar infoLog[1024];
        if(type != "PROGRAM")
        {
            glGetShaderiv(shader, GL_COMPILE_STATUS, &success);
            if(!success)
            {
                glGetShaderInfoLog(shader, 1024, NULL, infoLog);
                cout << "ERROR::SHADER_COMPILATION_ERROR of type: "<<type<<"\n"<<infoLog<<endl;
            }
        }
        else
        {
            glGetProgramiv(shader, GL_LINK_STATUS, &success);
            if(!success)
            {
                glGetProgramInfoLog(shader, 1024, NULL, infoLog);
                cout << "ERROR::PROGRAM_LINKING_ERROR of type: " << type << "\n"<<infoLog<<endl;
            }
        }
    }